

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Matrix<float,_2,_2> __thiscall
deqp::gles3::Functional::MatrixCaseUtils::negate<float,2,2>
          (MatrixCaseUtils *this,Matrix<float,_2,_2> *mat)

{
  float fVar1;
  float *pfVar2;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar3 [16];
  float in_XMM1_Da;
  float in_XMM1_Db;
  Matrix<float,_2,_2> MVar4;
  undefined4 local_24;
  undefined4 local_20;
  int c;
  int r;
  Matrix<float,_2,_2> *mat_local;
  Matrix<float,_2,_2> *retVal;
  
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  auVar3 = extraout_XMM0;
  for (local_20 = 0; MVar4.m_data.m_data[0].m_data = auVar3._0_8_, local_20 < 2;
      local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      pfVar2 = tcu::Matrix<float,_2,_2>::operator()(mat,local_20,local_24);
      fVar1 = *pfVar2;
      in_XMM1_Da = -0.0;
      in_XMM1_Db = -0.0;
      pfVar2 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,local_20,local_24);
      auVar3 = ZEXT416((uint)-fVar1);
      *pfVar2 = -fVar1;
    }
  }
  MVar4.m_data.m_data[1].m_data[1] = in_XMM1_Db;
  MVar4.m_data.m_data[1].m_data[0] = in_XMM1_Da;
  return (Matrix<float,_2,_2>)MVar4.m_data.m_data;
}

Assistant:

tcu::Matrix<T, Rows, Cols> negate (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = -mat(r, c);

	return retVal;
}